

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O3

void * compactor_thread(void *voidargs)

{
  openfiles_elem_conflict *elem;
  long lVar1;
  atomic<unsigned_char> aVar2;
  bool bVar3;
  fdb_status fVar4;
  int iVar5;
  avl_node *node;
  size_t sVar6;
  ulong uVar7;
  avl_node *paVar8;
  pthread_mutex_t *__mutex;
  ulong uVar9;
  fdb_file_handle *fhandle;
  list cmp_func_list;
  char vfilename [1024];
  openfiles_elem_conflict query;
  char new_filename [1024];
  fdb_file_handle *local_d90;
  list local_d88;
  char local_d78 [1024];
  timespec local_978 [81];
  avl_node local_468 [2];
  char local_438 [1032];
  
  pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
  if (compactor_terminate_signal.super___atomic_base<unsigned_char>._M_i == '\0') {
    local_978[0] = convert_reltime_to_abstime((int)sleep_duration * 1000);
    pthread_cond_timedwait
              ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,(timespec *)local_978);
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    do {
      pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
      node = avl_first(&openfiles);
      while (node != (avl_node *)0x0) {
        elem = (openfiles_elem_conflict *)(node + -0x36);
        if (node[-0xc].right == (avl_node *)0x0) {
          paVar8 = avl_next(node);
          avl_remove(&openfiles,node);
          free(elem);
          node = paVar8;
        }
        else {
          bVar3 = _compactor_is_threshold_satisfied(elem);
          if (bVar3) {
            *(undefined2 *)((long)&node[-1].left + 4) = 0x101;
            pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
            sVar6 = strlen((char *)elem);
            uVar7 = sVar6 & 0xffffffff;
            do {
              if ((int)uVar7 < 1) goto LAB_001264bc;
              uVar9 = uVar7 - 1;
              lVar1 = uVar7 - 0x511;
              uVar7 = uVar9;
            } while (*(char *)((long)node + lVar1) != '.');
            uVar9 = uVar9 & 0xffffffff;
            strncpy(local_d78,(char *)elem,uVar9);
            local_d78[uVar9] = '\0';
LAB_001264bc:
            local_d88 = (list)ZEXT816(0);
            fdb_cmp_func_list_from_filemgr((filemgr *)node[-0xc].right,&local_d88);
            fVar4 = fdb_open_for_compactor
                              (&local_d90,local_d78,(fdb_config *)(node + -0xb),&local_d88);
            fdb_free_cmp_func_list(&local_d88);
            if (fVar4 == FDB_RESULT_SUCCESS) {
              compactor_get_next_filename((char *)elem,local_438);
              fdb_compact_file(local_d90,local_438,false,0xffffffffffffffff,false,
                               (fdb_encryption_key *)0x0,(fdb_compact_opt *)0x0);
              fdb_close(local_d90);
              strcpy((char *)local_978,local_438);
              pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
              paVar8 = avl_search_greater(&openfiles,local_468,_compactor_cmp);
            }
            else {
              fprintf(_stderr,
                      "Error status code: %d, Failed to open the file \'%s\' for auto daemon compaction.\n"
                      ,(ulong)(uint)fVar4,local_d78);
              pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
              paVar8 = avl_next(node);
              *(undefined2 *)((long)&node[-1].left + 4) = 0;
            }
          }
          else if ((((ulong)(node[-0xc].right)->left & 0x1000000000) == 0) ||
                  (*(char *)((long)&node[-1].left + 6) != '\0')) {
            paVar8 = avl_next(node);
          }
          else {
            *(undefined1 *)((long)&node[-1].left + 6) = 1;
            pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
            iVar5 = (*(code *)node[-0xc].right[9].right[1].parent)
                              (*(undefined4 *)((long)&(node[-0xc].right)->right + 4));
            filemgr_remove_all_buffer_blocks((filemgr *)node[-0xc].right);
            pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
            if ((iVar5 != 0) && (node[-1].right != (avl_node *)0x0)) {
              compactor_thread();
            }
            filemgr_free_func((hash_elem *)(node[-0xc].right + 10));
            paVar8 = avl_next(node);
            avl_remove(&openfiles,node);
            free(elem);
          }
          node = paVar8;
          if (compactor_terminate_signal.super___atomic_base<unsigned_char>._M_i != '\0') {
            __mutex = &cpt_lock;
            goto LAB_0012670e;
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
      pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
      if (compactor_terminate_signal.super___atomic_base<unsigned_char>._M_i != '\0')
      goto LAB_001263da;
      local_d88 = (list)convert_reltime_to_abstime(15000);
      pthread_cond_timedwait
                ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,(timespec *)&local_d88)
      ;
      aVar2 = compactor_terminate_signal;
      pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    } while (aVar2.super___atomic_base<unsigned_char>._M_i == '\0');
  }
  else {
LAB_001263da:
    __mutex = &sync_mutex;
LAB_0012670e:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return (void *)0x0;
}

Assistant:

void * compactor_thread(void *voidargs)
{
    char vfilename[MAX_FNAMELEN];
    char new_filename[MAX_FNAMELEN];
    fdb_file_handle *fhandle;
    fdb_status fs;
    struct avl_node *a;
    struct openfiles_elem *elem;
    struct openfiles_elem query;

    // Sleep for a configured period by default to allow applications to warm up their data.
    // TODO: Need to implement more flexible way of scheduling the compaction
    // daemon (e.g., public APIs to start / stop the compaction daemon).
    mutex_lock(&sync_mutex);
    if (compactor_terminate_signal) {
        mutex_unlock(&sync_mutex);
        return NULL;
    }
    thread_cond_timedwait(&sync_cond, &sync_mutex, sleep_duration * 1000);
    mutex_unlock(&sync_mutex);

    while (1) {

        mutex_lock(&cpt_lock);
        a = avl_first(&openfiles);
        while(a) {
            elem = _get_entry(a, struct openfiles_elem, avl);
            if (!elem->file) {
                a = avl_next(a);
                avl_remove(&openfiles, &elem->avl);
                free(elem);
                continue;
            }

            if (_compactor_is_threshold_satisfied(elem)) {

                elem->daemon_compact_in_progress = true;
                // set compaction flag
                elem->compaction_flag = true;
                mutex_unlock(&cpt_lock);
                // Once 'daemon_compact_in_progress' is set to true, then it is safe to
                // read the variables of 'elem' until the compaction is completed.
                _compactor_get_vfilename(elem->filename, vfilename);

                // Get the list of custom compare functions.
                struct list cmp_func_list;
                list_init(&cmp_func_list);
                fdb_cmp_func_list_from_filemgr(elem->file, &cmp_func_list);
                fs = fdb_open_for_compactor(&fhandle, vfilename, &elem->config,
                                           &cmp_func_list);
                fdb_free_cmp_func_list(&cmp_func_list);

                if (fs == FDB_RESULT_SUCCESS) {
                    compactor_get_next_filename(elem->filename, new_filename);
                    fdb_compact_file(fhandle, new_filename, false, (bid_t) -1,
                                     false, NULL, NULL);
                    fdb_close(fhandle);

                    strcpy(query.filename, new_filename);
                    mutex_lock(&cpt_lock);
                    // Search the next file for compaction.
                    a = avl_search_greater(&openfiles, &query.avl, _compactor_cmp);
                } else {
                    // As a workaround for MB-17009, call fprintf instead of fdb_log
                    // until c->cgo->go callback trace issue is resolved.
                    fprintf(stderr,
                            "Error status code: %d, Failed to open the file "
                            "'%s' for auto daemon compaction.\n",
                            fs, vfilename);
                    // fail to open file
                    mutex_lock(&cpt_lock);
                    a = avl_next(&elem->avl);
                    elem->daemon_compact_in_progress = false;
                    // clear compaction flag
                    elem->compaction_flag = false;
                }

            } else if (_compactor_check_file_removal(elem)) {

                // remove file
                int ret;

                // set activation flag to prevent other compactor threads attempt
                // to remove the same file and double free the 'elem' structure,
                // during 'cpt_lock' is released.
                elem->removal_activated = true;

                mutex_unlock(&cpt_lock);
                // As the file is already unlinked, just close it.
                ret = elem->file->ops->close(elem->file->fd);
#if defined(WIN32) || defined(_WIN32)
                // For Windows, we need to manually remove the file.
                ret = remove(elem->file->filename);
#endif
                filemgr_remove_all_buffer_blocks(elem->file);
                mutex_lock(&cpt_lock);

                if (elem->log_callback && ret != 0) {
                    char errno_msg[512];
                    elem->file->ops->get_errno_str(errno_msg, 512);
                    // As a workaround for MB-17009, call fprintf instead of fdb_log
                    // until c->cgo->go callback trace issue is resolved.
                    fprintf(stderr,
                            "Error status code: %d, Error in REMOVE on a "
                            "database file '%s', %s",
                            ret, elem->file->filename, errno_msg);
                }

                // free filemgr structure
                filemgr_free_func(&elem->file->e);
                // remove & free elem
                a = avl_next(a);
                avl_remove(&openfiles, &elem->avl);
                free(elem);

            } else {

                // next
                a = avl_next(a);

            }
            if (compactor_terminate_signal) {
                mutex_unlock(&cpt_lock);
                return NULL;
            }
        }
        mutex_unlock(&cpt_lock);

        mutex_lock(&sync_mutex);
        if (compactor_terminate_signal) {
            mutex_unlock(&sync_mutex);
            break;
        }
        // As each database file can be opened at different times, we need to
        // wake up each compaction thread with a shorter interval to check if
        // the time since the last compaction of a given file is already passed
        // by a configured compaction interval and consequently the file should
        // be compacted or not.
        thread_cond_timedwait(&sync_cond, &sync_mutex, 15 * 1000); // Wait for 15 secs.
        if (compactor_terminate_signal) {
            mutex_unlock(&sync_mutex);
            break;
        }
        mutex_unlock(&sync_mutex);
    }
    return NULL;
}